

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeTetra>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  pair<int,_long> *ppVar6;
  ostream *poVar7;
  void *this;
  long in_RDI;
  int ivs;
  int maxd_1;
  int maxd;
  int d_1;
  int include_1;
  int shord [3];
  int maxorder [3];
  int sidedimension_1;
  int ish_1;
  int lastshape_1;
  int firstshape_1;
  MElementType tipo;
  int dir;
  int bil;
  int side_2;
  int ivec_1;
  int locvec_1;
  int d;
  int include;
  int sidedimension;
  int ish;
  int lastshape;
  int firstshape;
  int order;
  int connectindex;
  int face;
  int side_1;
  int ivec;
  int locvec;
  int firstface;
  int64_t nvec;
  TPZManVector<long,_27> FirstIndex;
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  int i;
  int counthold;
  TPZManVector<int,_27> permgather;
  int nlowdim;
  TPZStack<int,_10> smallsides;
  int side;
  int count;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_10> facevector;
  int nexternalvectors;
  int nshape;
  int pressureorder;
  TPZManVector<int,_45> normalsides;
  TPZManVector<int,_45> directions;
  TPZManVector<int,_45> bilinear;
  TPZManVector<int,_45> VectorSides;
  int64_t numvec;
  int *in_stack_fffffffffffff688;
  TPZManVector<int,_81> *in_stack_fffffffffffff690;
  TPZGenMatrix<int> *in_stack_fffffffffffff698;
  TPZStack<int,_10> *in_stack_fffffffffffff6a0;
  TPZVec<int> *in_stack_fffffffffffff6a8;
  TPZManVector<int,_81> *in_stack_fffffffffffff6b0;
  TPZVec<int> *in_stack_fffffffffffff6b8;
  TPZManVector<int,_10> *in_stack_fffffffffffff6c0;
  TPZGenMatrix<int> *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  TPZVec<long> *in_stack_fffffffffffff710;
  TPZVec<int> *in_stack_fffffffffffff720;
  TPZShapeData *in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff730;
  pair<int,_int> local_7ec;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4 [4];
  int local_7c4;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  int local_7b0;
  MElementType local_7ac;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  int local_798;
  pair<int,_int> local_794;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  int local_778;
  int local_774;
  int local_770;
  int local_76c;
  int local_768;
  int local_764;
  int local_760;
  undefined4 local_75c;
  int64_t local_758;
  TPZVec<long> local_750 [7];
  int local_654;
  int local_638;
  int local_634;
  TPZVec<int> local_630 [4];
  int local_59c;
  TPZVec<int> local_598 [2];
  size_t in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  int iVar8;
  undefined4 in_stack_fffffffffffffab4;
  int iVar9;
  TPZVec<int> local_548 [11];
  undefined4 local_3dc;
  TPZVec<int> local_3d8 [2];
  int local_38c;
  int local_388;
  int local_384;
  TPZVec<int> local_2a8 [7];
  TPZVec<int> local_1c0 [6];
  TPZVec<int> local_e8 [6];
  undefined8 local_10;
  long local_8;
  
  local_10 = 0x2d;
  local_8 = in_RDI;
  TPZManVector<int,_45>::TPZManVector
            ((TPZManVector<int,_45> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8);
  TPZManVector<int,_45>::TPZManVector
            ((TPZManVector<int,_45> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8);
  TPZManVector<int,_45>::TPZManVector
            ((TPZManVector<int,_45> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8);
  TPZManVector<int,_45>::TPZManVector
            ((TPZManVector<int,_45> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8);
  pztopology::TPZTetrahedron::GetSideHDivDirections
            (&in_stack_fffffffffffff6c0->super_TPZVec<int>,in_stack_fffffffffffff6b8,
             &in_stack_fffffffffffff6b0->super_TPZVec<int>,in_stack_fffffffffffff6a8);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
  }
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),4);
  local_384 = *piVar3;
  local_388 = pzshape::TPZShapeTetra::NShapeF(&in_stack_fffffffffffff690->super_TPZVec<int>);
  local_38c = 0;
  TPZVec<int>::size(local_e8);
  local_3dc = 0xe;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff6c0,(int64_t)in_stack_fffffffffffff6b8,
             (int *)in_stack_fffffffffffff6b0);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8);
  iVar9 = 0;
  for (iVar8 = 0; iVar1 = iVar9, iVar8 < 0xf; iVar8 = iVar8 + 1) {
    iVar1 = pztopology::TPZTetrahedron::SideDimension(0x18ac3f0);
    if (iVar1 == 2) {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffff6a0);
      pztopology::TPZTetrahedron::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff698);
      iVar2 = TPZVec<int>::NElements(local_598);
      local_59c = (int)iVar2 + 1;
      TPZManVector<int,_27>::TPZManVector
                ((TPZManVector<int,_27> *)in_stack_fffffffffffff6b0,
                 (int64_t)in_stack_fffffffffffff6a8);
      HDivPermutation((int)((ulong)in_stack_fffffffffffff730 >> 0x20),in_stack_fffffffffffff728,
                      in_stack_fffffffffffff720);
      local_634 = iVar9;
      iVar9 = local_634;
      for (local_638 = 0; local_638 < local_59c; local_638 = local_638 + 1) {
        piVar3 = TPZVec<int>::operator[](local_630,(long)local_638);
        iVar1 = *piVar3 + local_634;
        piVar3 = TPZVec<int>::operator[](local_548,(long)(local_634 + local_638));
        *piVar3 = iVar1;
        iVar1 = iVar8;
        piVar3 = TPZVec<int>::operator[](local_3d8,(long)iVar9);
        *piVar3 = iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar1;
      }
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)in_stack_fffffffffffff690);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18ac613);
    }
  }
  while (local_38c = iVar1, lVar4 = (long)iVar9, iVar2 = TPZVec<int>::size(local_548), lVar4 < iVar2
        ) {
    iVar1 = iVar9;
    piVar3 = TPZVec<int>::operator[](local_548,(long)iVar9);
    *piVar3 = iVar9;
    iVar9 = iVar1 + 1;
    iVar1 = local_38c;
  }
  TPZGenMatrix<int>::TPZGenMatrix
            ((TPZGenMatrix<int> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8,
             (int64_t)in_stack_fffffffffffff6a0);
  pzshape::TPZShapeTetra::ShapeOrder
            (in_stack_fffffffffffff710,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),4);
  local_654 = *piVar3 + 1;
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)in_stack_fffffffffffff6b0,(int64_t)in_stack_fffffffffffff6a8)
  ;
  FirstShapeIndex((TPZVec<long> *)in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
  local_758 = TPZVec<int>::NElements(local_e8);
  iVar9 = 0;
  local_75c = 10;
  for (local_760 = 0; local_760 < local_38c; local_760 = local_760 + 1) {
    piVar3 = TPZVec<int>::operator[](local_548,(long)local_760);
    local_764 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_e8,(long)local_764);
    local_768 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_3d8,(long)local_760);
    local_76c = *piVar3;
    local_770 = local_76c + -10;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),(long)local_770);
    local_774 = *piVar3;
    plVar5 = TPZVec<long>::operator[](local_750,(long)local_768);
    local_778 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_750,(long)(local_768 + 1));
    local_77c = (int)*plVar5;
    for (local_780 = local_778; local_780 < local_77c; local_780 = local_780 + 1) {
      local_784 = pztopology::TPZTetrahedron::SideDimension(0x18ac93a);
      local_788 = 1;
      for (local_78c = 0; local_78c < local_784; local_78c = local_78c + 1) {
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                            (int64_t)in_stack_fffffffffffff688);
        if (local_774 < *piVar3) {
          local_788 = 0;
        }
      }
      if (local_788 != 0) {
        local_794 = std::make_pair<int&,int&>(in_stack_fffffffffffff688,(int *)0x18aca38);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_794);
        iVar9 = iVar9 + 1;
      }
    }
  }
  for (local_798 = local_38c; local_798 < local_758; local_798 = local_798 + 1) {
    piVar3 = TPZVec<int>::operator[](local_548,(long)local_798);
    local_79c = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_e8,(long)local_79c);
    local_7a0 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_1c0,(long)local_79c);
    local_7a4 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_2a8,(long)local_79c);
    local_7a8 = *piVar3;
    local_7ac = pztopology::TPZTetrahedron::Type(local_7a0);
    plVar5 = TPZVec<long>::operator[](local_750,(long)local_7a0);
    local_7b0 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_750,(long)(local_7a0 + 1));
    local_7b4 = (int)*plVar5;
    for (local_7b8 = local_7b0; local_7b8 < local_7b4; local_7b8 = local_7b8 + 1) {
      local_7bc = pztopology::TPZTetrahedron::SideDimension(0x18acc5e);
      local_7d4[3] = local_384;
      local_7c4 = local_384;
      local_7c0 = local_384;
      if (local_7a4 != 0) {
        local_7d4[(long)local_7a8 + 3] = local_7d4[(long)local_7a8 + 3] + 1;
      }
      memset(local_7d4,0,0xc);
      local_7d8 = 1;
      for (local_7dc = 0; local_7dc < local_7bc; local_7dc = local_7dc + 1) {
        if ((local_7ac == ETriangle) || (local_7ac == ETetraedro)) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          local_7d4[local_7dc] = *piVar3;
          local_7e0 = local_7d4[(long)local_7dc + 3] + 1;
          if (local_7e0 < local_7d4[local_7dc]) {
            local_7d8 = 0;
          }
        }
        else if (local_7ac == EQuadrilateral) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          local_7d4[local_7dc] = *piVar3;
          local_7e4 = local_7d4[(long)local_7dc + 3];
          if (local_7e4 < local_7d4[local_7dc]) {
            local_7d8 = 0;
          }
        }
        else if (local_7ac == ECube) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          local_7d4[local_7dc] = *piVar3;
          if (local_7d4[(long)local_7dc + 3] < local_7d4[local_7dc]) {
            local_7d8 = 0;
          }
        }
        else if (local_7ac == EPrisma) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          if (local_7d4[(long)local_7dc + 3] < *piVar3) {
            local_7d8 = 0;
          }
        }
        else if (local_7ac == EOned) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          local_7d4[0] = *piVar3;
          if (local_7d4[(long)local_7dc + 3] < *piVar3) {
            local_7d8 = 0;
          }
        }
        else if (local_7ac == EPiramide) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff698,(int64_t)in_stack_fffffffffffff690,
                              (int64_t)in_stack_fffffffffffff688);
          local_7d4[local_7dc] = *piVar3;
          if (local_7d4[(long)local_7dc + 3] < local_7d4[local_7dc]) {
            local_7d8 = 0;
          }
        }
        else {
          pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffffaa8);
        }
      }
      if (local_7d8 != 0) {
        local_7ec = std::make_pair<int&,int&>(in_stack_fffffffffffff688,(int *)0x18acffc);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_7ec);
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar9 != (int)iVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"count ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    in_stack_fffffffffffff690 = (TPZManVector<int,_81> *)std::operator<<(poVar7,"\nivs ");
    this = (void *)std::ostream::operator<<(in_stack_fffffffffffff690,(int)iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffffaa8);
  }
  TPZManVector<long,_27>::~TPZManVector((TPZManVector<long,_27> *)in_stack_fffffffffffff690);
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff690);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff690);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffff690);
  TPZManVector<int,_45>::~TPZManVector((TPZManVector<int,_45> *)in_stack_fffffffffffff690);
  TPZManVector<int,_45>::~TPZManVector((TPZManVector<int,_45> *)in_stack_fffffffffffff690);
  TPZManVector<int,_45>::~TPZManVector((TPZManVector<int,_45> *)in_stack_fffffffffffff690);
  TPZManVector<int,_45>::~TPZManVector((TPZManVector<int,_45> *)in_stack_fffffffffffff690);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}